

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::ReorganizeDataLayerParams::_InternalParse
          (ReorganizeDataLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
      tag_00 = local_34;
      if (local_34 >> 3 == 2) break;
      if ((local_34 >> 3 == 1) && ((char)local_34 == '\b')) {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        this->mode_ = (int)uVar2;
      }
      else {
LAB_0020430b:
        if ((local_34 == 0) || ((local_34 & 7) == 4)) {
          if (local_40 == (char *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
          return local_40;
        }
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields<std::__cxx11::string>
                            (&(this->super_MessageLite)._internal_metadata_);
        local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
      }
    }
    if ((char)local_34 != '\x10') goto LAB_0020430b;
    uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
    this->blocksize_ = uVar2;
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ReorganizeDataLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_mode(static_cast<::CoreML::Specification::ReorganizeDataLayerParams_ReorganizationType>(val));
        } else
          goto handle_unusual;
        continue;
      // uint64 blockSize = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          blocksize_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}